

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlReaderNewWalker(void)

{
  int iVar1;
  int iVar2;
  xmlTextReaderPtr val;
  xmlDocPtr val_00;
  int local_34;
  int n_doc;
  xmlDocPtr doc;
  int n_reader;
  xmlTextReaderPtr reader;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 4; doc._4_4_ = doc._4_4_ + 1) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlTextReaderPtr(doc._4_4_,0);
      val_00 = gen_xmlDocPtr(local_34,1);
      iVar2 = xmlReaderNewWalker(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlTextReaderPtr(doc._4_4_,val,0);
      des_xmlDocPtr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReaderNewWalker",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)doc._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlReaderNewWalker(void) {
    int test_ret = 0;

#if defined(LIBXML_READER_ENABLED)
    int mem_base;
    int ret_val;
    xmlTextReaderPtr reader; /* an XML reader */
    int n_reader;
    xmlDocPtr doc; /* a preparsed document */
    int n_doc;

    for (n_reader = 0;n_reader < gen_nb_xmlTextReaderPtr;n_reader++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
        mem_base = xmlMemBlocks();
        reader = gen_xmlTextReaderPtr(n_reader, 0);
        doc = gen_xmlDocPtr(n_doc, 1);

        ret_val = xmlReaderNewWalker(reader, doc);
        desret_int(ret_val);
        call_tests++;
        des_xmlTextReaderPtr(n_reader, reader, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlReaderNewWalker",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_reader);
            printf(" %d", n_doc);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}